

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O1

void __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
::_delete_label(BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *label_i,
               bool force_delete)

{
  pointer pcVar1;
  double *pdVar2;
  long lVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __position;
  mapped_type *pmVar4;
  char *pcVar5;
  long lVar6;
  pointer pbVar7;
  long lVar8;
  double *pdVar9;
  mapped_type mVar10;
  long lVar11;
  double dVar12;
  Scalar SVar13;
  scalar_sum_op<double,_double> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
  local_88;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>
  local_48;
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         ((this->_idx_to_label).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->_idx_to_label).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,label_i);
  if (__position._M_current !=
      (this->_idx_to_label).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (!force_delete) {
      pdVar2 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data;
      lVar11 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      if (lVar11 < 0 && pdVar2 != (double *)0x0) {
        pcVar5 = 
        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, Level = 0]"
        ;
LAB_00177b94:
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar5);
      }
      lVar6 = (long)__position._M_current -
              (long)(this->_idx_to_label).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      if ((lVar6 < 0) ||
         (lVar3 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar3 <= lVar6)) {
        pcVar5 = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
        ;
LAB_00177bb3:
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,pcVar5);
      }
      if (lVar11 == 0) {
        dVar12 = 0.0;
      }
      else {
        if (lVar11 < 1) {
          pcVar5 = 
          "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
          ;
          goto LAB_00177bd2;
        }
        dVar12 = pdVar2[lVar6] * pdVar2[lVar6];
        if (lVar11 != 1) {
          lVar8 = lVar11 + -1;
          pdVar9 = pdVar2 + lVar3 + lVar6;
          do {
            dVar12 = dVar12 + *pdVar9 * *pdVar9;
            pdVar9 = pdVar9 + lVar3;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
      }
      if (2.220446049250313e-16 < dVar12) {
        return;
      }
      if (lVar3 < 0 && pdVar2 != (double *)0x0) {
        pcVar5 = 
        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, Level = 0]"
        ;
        goto LAB_00177b94;
      }
      if (lVar11 <= lVar6) {
        pcVar5 = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = -1, InnerPanel = true]"
        ;
        goto LAB_00177bb3;
      }
      local_88.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_0>.m_data =
           pdVar2 + lVar3 * lVar6;
      local_88.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>.m_startCol.
      m_value = 0;
      local_88.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_0>.m_cols.
      m_value = lVar3;
      local_88.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>.m_xpr =
           &this->_quadmat;
      local_88.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>.m_startRow.
      m_value = lVar6;
      local_88.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>.
      m_outerStride = lVar3;
      if (lVar3 != 0) {
        if (lVar3 < 1) {
          pcVar5 = 
          "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
          ;
LAB_00177bd2:
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,pcVar5);
        }
        local_48.
        super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>
        .
        super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
        .m_d.argImpl.
        super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
        .m_data = local_88.m_xpr.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_0>
                  .m_data;
        local_48.
        super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>
        .
        super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
        .m_d.argImpl.
        super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
        .m_outerStride.m_value = lVar3;
        SVar13 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,1,-1,true>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>const>>
                           (&local_48,&local_a9,&local_88);
        if (2.220446049250313e-16 < SVar13) {
          return;
        }
      }
    }
    pcVar1 = (label_i->_M_dataplus)._M_p;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar1,pcVar1 + label_i->_M_string_length);
    _delete_label_from_mat<cimod::Dense>(this,&local_a8,(dispatch_t<cimod::Dense,_Dense>)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&this->_idx_to_label,(iterator)__position._M_current);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&(this->_label_to_idx)._M_h);
    pbVar7 = (this->_idx_to_label).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->_idx_to_label).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pbVar7) {
      lVar11 = 0;
      mVar10 = 0;
      do {
        pmVar4 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->_label_to_idx,
                              (key_type *)((long)&(pbVar7->_M_dataplus)._M_p + lVar11));
        *pmVar4 = mVar10;
        mVar10 = mVar10 + 1;
        pbVar7 = (this->_idx_to_label).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 0x20;
      } while (mVar10 < (ulong)((long)(this->_idx_to_label).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5
                               ));
    }
  }
  return;
}

Assistant:

inline void _delete_label( IndexType label_i, bool force_delete = true ) {
      auto position = std::find( _idx_to_label.begin(), _idx_to_label.end(), label_i );
      if ( position != _idx_to_label.end() ) {
        if ( force_delete == false ) {
          // check if there are corresponding nonzero elements
          size_t i = std::distance( _idx_to_label.begin(), position );
          if ( _quadmat.col( i ).squaredNorm() > std::numeric_limits<FloatType>::epsilon()
               || _quadmat.row( i ).squaredNorm() > std::numeric_limits<FloatType>::epsilon() ) {
            // exists nonzero elements
            return;
          }
        }
        // delete from matrix first
        _delete_label_from_mat( label_i );
        // add label_i
        _idx_to_label.erase( position );
        // already sorted
        // std::sort(_idx_to_label.begin(), _idx_to_label.end());
        _set_label_to_idx();
      }
    }